

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdDecodeBase58(void *handle,char *base58,bool use_checksum,char **output)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 *in_RCX;
  byte in_DL;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  ByteData data_1;
  ByteData data;
  string *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe80;
  string local_178;
  allocator local_151;
  string local_150 [32];
  ByteData local_130;
  string local_118;
  allocator local_f1;
  string local_f0 [32];
  ByteData local_d0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  byte local_19;
  char *local_18;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_19 = in_DL & 1;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x38c;
    local_50.funcname = "CfdDecodeBase58";
    cfd::core::logger::warn<>(&local_50,"base58 is null or empty.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. base58 is null or empty.",&local_71)
    ;
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe40,error_code,in_stack_fffffffffffffe30);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_28 == (undefined8 *)0x0) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x392;
    local_90.funcname = "CfdDecodeBase58";
    cfd::core::logger::warn<>(&local_90,"output is null.");
    local_b2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. output is null.",&local_b1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe40,error_code,in_stack_fffffffffffffe30);
    local_b2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_19 & 1) == 0) {
    paVar4 = &local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,local_18,paVar4);
    cfd::core::CryptoUtil::DecodeBase58(&local_130,(string *)local_150);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_178,&local_130);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffe80);
    *local_28 = pcVar3;
    std::__cxx11::string::~string((string *)&local_178);
    cfd::core::ByteData::~ByteData((ByteData *)0x57ac01);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,local_18,&local_f1);
    cfd::core::CryptoUtil::DecodeBase58Check(&local_d0,(string *)local_f0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_118,&local_d0);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffe80);
    *local_28 = pcVar3;
    std::__cxx11::string::~string((string *)&local_118);
    cfd::core::ByteData::~ByteData((ByteData *)0x57aab5);
  }
  return 0;
}

Assistant:

int CfdDecodeBase58(
    void* handle, const char* base58, bool use_checksum, char** output) {
  try {
    cfd::Initialize();
    if (cfd::capi::IsEmptyString(base58)) {
      warn(CFD_LOG_SOURCE, "base58 is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. base58 is null or empty.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    if (use_checksum) {
      auto data =
          cfd::core::CryptoUtil::DecodeBase58Check(std::string(base58));
      *output = cfd::capi::CreateString(data.GetHex());
    } else {
      auto data = cfd::core::CryptoUtil::DecodeBase58(std::string(base58));
      *output = cfd::capi::CreateString(data.GetHex());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}